

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  char *label_00;
  byte bVar1;
  bool bVar2;
  float items_height;
  ImVec2 local_80;
  char *local_78;
  char *item_text;
  int local_68;
  bool item_selected;
  int i;
  undefined1 local_54 [8];
  ImGuiListClipper clipper;
  bool value_changed;
  int height_in_items_local;
  int items_count_local;
  void *data_local;
  _func_bool_void_ptr_int_char_ptr_ptr *items_getter_local;
  int *current_item_local;
  char *label_local;
  
  clipper.DisplayEnd = height_in_items;
  bVar2 = ListBoxHeader(label,items_count,height_in_items);
  if (bVar2) {
    clipper.DisplayStart._3_1_ = 0;
    items_height = GetTextLineHeightWithSpacing();
    ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_54,items_count,items_height);
    while (bVar2 = ImGuiListClipper::Step((ImGuiListClipper *)local_54), bVar2) {
      for (local_68 = clipper.ItemsCount; local_68 < clipper.StepNo; local_68 = local_68 + 1) {
        item_text._7_1_ = local_68 == *current_item;
        bVar2 = (*items_getter)(data,local_68,&local_78);
        if (!bVar2) {
          local_78 = "*Unknown item*";
        }
        PushID(local_68);
        bVar1 = item_text._7_1_;
        label_00 = local_78;
        ImVec2::ImVec2(&local_80,0.0,0.0);
        bVar2 = Selectable(label_00,(bool)(bVar1 & 1),0,&local_80);
        if (bVar2) {
          *current_item = local_68;
          clipper.DisplayStart._3_1_ = 1;
        }
        if ((item_text._7_1_ & 1) != 0) {
          SetItemDefaultFocus();
        }
        PopID();
      }
    }
    ListBoxFooter();
    label_local._7_1_ = (bool)(clipper.DisplayStart._3_1_ & 1);
    ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_54);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    if (!ListBoxHeader(label, items_count, height_in_items))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different or variable sizes you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const bool item_selected = (i == *current_item);
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    ListBoxFooter();
    return value_changed;
}